

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

double dist_average_time<double,xorshf,std::uniform_real_distribution<double>>
                 (uniform_real_distribution<double> *dist,xorshf *generator,size_t trials,
                 size_t times)

{
  long lVar1;
  uniform_real_distribution<double> *in_RCX;
  timer *in_RDX;
  double dVar2;
  undefined1 auVar3 [16];
  timer elapsed;
  size_t i;
  double average_time;
  timer *this;
  xorshf *generator_00;
  
  generator_00 = (xorshf *)0x0;
  for (this = (timer *)0x0; this < in_RDX; this = (timer *)((long)&(this->start).__d.__r + 1)) {
    timer::timer(this);
    dist_single_run<double,xorshf,std::uniform_real_distribution<double>>
              (in_RCX,generator_00,(size_t)this);
    dVar2 = timer::elapsed((timer *)in_RCX);
    generator_00 = (xorshf *)(dVar2 + (double)generator_00);
  }
  lVar1 = (long)in_RDX * (long)in_RCX;
  auVar3._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar3._0_8_ = lVar1;
  auVar3._12_4_ = 0x45300000;
  return (((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)generator_00) /
         1000000.0;
}

Assistant:

double dist_average_time(D& dist, G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        dist_single_run<Real>( dist, generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}